

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int __thiscall ON_wString::ReplaceWhiteSpace(ON_wString *this,wchar_t token,wchar_t *whitespace)

{
  wchar_t wVar1;
  int iVar2;
  long lVar3;
  wchar_t *pwVar4;
  ON_Internal_Empty_wString *pOVar5;
  wchar_t *pwVar6;
  long lVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  
  pwVar4 = this->m_s;
  iVar2 = 0;
  if (pwVar4 != (wchar_t *)0x0) {
    pwVar6 = pwVar4 + pwVar4[-2];
    if ((whitespace == (wchar_t *)0x0) || (pwVar8 = pwVar4, *whitespace == L'\0')) {
      lVar3 = 0;
      do {
        if (pwVar6 <= pwVar4) {
          return 0;
        }
        wVar1 = *pwVar4;
        lVar3 = lVar3 + 0x100000000;
      } while ((wVar1 != L'\x7f') && (pwVar4 = pwVar4 + 1, 0x1f < (uint)(wVar1 + L'\xffffffff')));
      CopyArray(this);
      pwVar4 = this->m_s;
      lVar3 = lVar3 >> 0x20;
      pOVar5 = &empty_wstring;
      if (pwVar4 != (wchar_t *)0x0) {
        pOVar5 = (ON_Internal_Empty_wString *)(pwVar4 + -3);
      }
      lVar7 = (long)(pOVar5->header).string_length;
      pwVar4[lVar3 + -1] = token;
      iVar2 = 1;
      if (lVar3 < lVar7) {
        pwVar6 = pwVar4 + lVar3;
        iVar2 = 1;
        do {
          if (*pwVar6 == L'\x7f' || (uint)(*pwVar6 + L'\xffffffff') < 0x20) {
            *pwVar6 = token;
            iVar2 = iVar2 + 1;
          }
          pwVar6 = pwVar6 + 1;
        } while (pwVar6 < pwVar4 + lVar7);
      }
    }
    else {
      do {
        if (pwVar6 <= pwVar8) {
          return 0;
        }
        pwVar9 = whitespace;
        do {
          wVar1 = *pwVar9;
          if (wVar1 == *pwVar8) break;
          pwVar9 = pwVar9 + 1;
        } while (wVar1 != L'\0');
        pwVar8 = pwVar8 + 1;
      } while (wVar1 == L'\0');
      CopyArray(this);
      pwVar6 = this->m_s;
      lVar3 = (long)(int)((ulong)((long)pwVar8 - (long)pwVar4) >> 2);
      pOVar5 = &empty_wstring;
      if (pwVar6 != (wchar_t *)0x0) {
        pOVar5 = (ON_Internal_Empty_wString *)(pwVar6 + -3);
      }
      lVar7 = (long)(pOVar5->header).string_length;
      pwVar6[lVar3 + -1] = token;
      iVar2 = 1;
      if (lVar3 < lVar7) {
        pwVar4 = pwVar6 + lVar3;
        iVar2 = 1;
        do {
          pwVar8 = whitespace;
          do {
            wVar1 = *pwVar8;
            if (wVar1 == *pwVar4) break;
            pwVar8 = pwVar8 + 1;
          } while (wVar1 != L'\0');
          if (wVar1 != L'\0') {
            *pwVar4 = token;
            iVar2 = iVar2 + 1;
          }
          pwVar4 = pwVar4 + 1;
        } while (pwVar4 < pwVar6 + lVar7);
      }
    }
  }
  return iVar2;
}

Assistant:

int ON_wString::ReplaceWhiteSpace( wchar_t token, const wchar_t* whitespace )
{
  wchar_t* s0;
  wchar_t* s1;
  int n;
  wchar_t c;

  if ( 0 == (s0 = m_s) )
    return 0;
  s1 = s0 + Length();
  if ( whitespace && *whitespace )
  {
    while( s0 < s1 )
    {
      if (IsWhiteSpaceHelper(*s0++,whitespace))
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s1 = m_s + Length();
        s0[-1] = token;
        n = 1;
        while ( s0 < s1 )
        {
          if ( IsWhiteSpaceHelper(*s0++,whitespace) )
          {
            s0[-1] = token;
            n++;
          }
        }
        return n;
      }
    }
  }
  else
  {
    while( s0 < s1 )
    {
      c = *s0++;
      if ( (1 <= c && c <= 32) || 127 == c )
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s1 = m_s + Length();
        s0[-1] = token;
        n = 1;
        while ( s0 < s1 )
        {
          c = *s0++;
          if ( (1 <= c && c <= 32) || 127 == c )
          {
            s0[-1] = token;
            n++;
          }
        }
        return n;
      }
    }
  }
  return 0;
}